

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O2

SUNErrCode SUNProfiler_Reset(SUNProfiler p)

{
  sunTimerStruct *psVar1;
  sunTimespec *psVar2;
  SUNHashMapKeyValue pSVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  
  if (p != (SUNProfiler)0x0) {
    psVar1 = p->overhead;
    psVar2 = psVar1->tic;
    psVar2->tv_sec = 0;
    psVar2->tv_nsec = 0;
    psVar2 = psVar1->toc;
    psVar2->tv_sec = 0;
    psVar2->tv_nsec = 0;
    psVar1->elapsed = 0.0;
    psVar1->count = 0;
    psVar1->average = 0.0;
    psVar1->maximum = 0.0;
    sunStartTiming(p->overhead);
    for (lVar6 = 0; lVar6 < p->map->max_size; lVar6 = lVar6 + 1) {
      pSVar3 = p->map->buckets[lVar6];
      if ((pSVar3 != (SUNHashMapKeyValue)0x0) &&
         (puVar4 = (undefined8 *)pSVar3->value, puVar4 != (undefined8 *)0x0)) {
        puVar5 = (undefined8 *)*puVar4;
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar5 = (undefined8 *)puVar4[1];
        *puVar5 = 0;
        puVar5[1] = 0;
        puVar4[4] = 0;
        puVar4[5] = 0;
        puVar4[2] = 0;
        puVar4[3] = 0;
      }
    }
    p->sundials_time = 0.0;
    sunStopTiming(p->overhead);
    return 0;
  }
  return -9999;
}

Assistant:

SUNErrCode SUNProfiler_Reset(SUNProfiler p)
{
  int i                 = 0;
  sunTimerStruct* timer = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  /* Reset the overhead timer */
  sunResetTiming(p->overhead);
  sunStartTiming(p->overhead);

  /* Reset all timers */
  for (i = 0; i < p->map->max_size; i++)
  {
    if (!(p->map->buckets[i])) { continue; }
    timer = p->map->buckets[i]->value;
    if (timer) { sunResetTiming(timer); }
  }

  /* Reset the overall timer. */
  p->sundials_time = 0.0;

  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);
  sunStopTiming(p->overhead);

  return SUN_SUCCESS;
}